

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

int Ivy_ManLevels(Ivy_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  int i;
  uint uVar3;
  
  uVar3 = 0;
  for (i = 0; i < p->vPos->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p->vPos,i);
    uVar1 = *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 8) >> 0xb;
    if (uVar3 <= uVar1) {
      uVar3 = uVar1;
    }
  }
  return uVar3;
}

Assistant:

int Ivy_ManLevels( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax = 0;
    Ivy_ManForEachPo( p, pObj, i )
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    return LevelMax;
}